

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Schema __thiscall capnp::SchemaLoader::load(SchemaLoader *this,Reader *reader)

{
  RawSchema *pRVar1;
  
  kj::_::Mutex::lock((Mutex *)this,0);
  pRVar1 = Impl::load((this->impl).value.ptr,reader,false);
  kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  return (Schema)&pRVar1->defaultBrand;
}

Assistant:

Schema SchemaLoader::load(const schema::Node::Reader& reader) {
  return Schema(&impl.lockExclusive()->get()->load(reader, false)->defaultBrand);
}